

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

DOHcode skipqname(uchar *doh,size_t dohlen,uint *indexp)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = *indexp;
  do {
    if (dohlen < uVar2 + 1) {
      return DOH_DNS_OUT_OF_RANGE;
    }
    bVar1 = doh[uVar2];
    if ((bVar1 & 0xc0) != 0) {
      if ((bVar1 & 0xc0) != 0xc0) {
        return DOH_DNS_BAD_LABEL;
      }
      if (uVar2 + 2 <= dohlen) {
        *indexp = uVar2 + 2;
        return DOH_OK;
      }
      return DOH_DNS_OUT_OF_RANGE;
    }
    uVar2 = uVar2 + 1 + (uint)bVar1;
    if (dohlen < uVar2) {
      return DOH_DNS_OUT_OF_RANGE;
    }
    *indexp = uVar2;
  } while (bVar1 != 0);
  return DOH_OK;
}

Assistant:

static DOHcode skipqname(const unsigned char *doh, size_t dohlen,
                         unsigned int *indexp)
{
  unsigned char length;
  do {
    if(dohlen < (*indexp + 1))
      return DOH_DNS_OUT_OF_RANGE;
    length = doh[*indexp];
    if((length & 0xc0) == 0xc0) {
      /* name pointer, advance over it and be done */
      if(dohlen < (*indexp + 2))
        return DOH_DNS_OUT_OF_RANGE;
      *indexp += 2;
      break;
    }
    if(length & 0xc0)
      return DOH_DNS_BAD_LABEL;
    if(dohlen < (*indexp + 1 + length))
      return DOH_DNS_OUT_OF_RANGE;
    *indexp += 1 + length;
  } while(length);
  return DOH_OK;
}